

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trend_suite.cpp
# Opt level: O1

void double_suite::run(void)

{
  test_ctor();
  test_same();
  test_linear_increase();
  test_linear_increase_offset();
  test_linear_decrease();
  test_alternating();
  test_scatter();
  test_clear();
  return;
}

Assistant:

void run()
{
    test_ctor();
    test_same();
    test_linear_increase();
    test_linear_increase_offset();
    test_linear_decrease();
    test_alternating();
    test_scatter();
    test_clear();
}